

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPart.c
# Opt level: O0

Vec_Ptr_t * Aig_ManPartitionNaive(Aig_Man_t *p,int nPartSize)

{
  int iVar1;
  int iVar2;
  Vec_Vec_t *p_00;
  Vec_Int_t *p_01;
  int local_30;
  int i;
  int nParts;
  Aig_Obj_t *pObj;
  Vec_Ptr_t *vParts;
  int nPartSize_local;
  Aig_Man_t *p_local;
  
  iVar1 = Aig_ManCoNum(p);
  iVar2 = Aig_ManCoNum(p);
  p_00 = Vec_VecStart(iVar1 / nPartSize + (uint)(0 < iVar2 % nPartSize));
  for (local_30 = 0; iVar1 = Vec_PtrSize(p->vCos), local_30 < iVar1; local_30 = local_30 + 1) {
    Vec_PtrEntry(p->vCos,local_30);
    p_01 = (Vec_Int_t *)Vec_PtrEntry((Vec_Ptr_t *)p_00,local_30 / nPartSize);
    Vec_IntPush(p_01,local_30);
  }
  return (Vec_Ptr_t *)p_00;
}

Assistant:

Vec_Ptr_t * Aig_ManPartitionNaive( Aig_Man_t * p, int nPartSize )
{
    Vec_Ptr_t * vParts;
    Aig_Obj_t * pObj;
    int nParts, i;
    nParts = (Aig_ManCoNum(p) / nPartSize) + ((Aig_ManCoNum(p) % nPartSize) > 0);
    vParts = (Vec_Ptr_t *)Vec_VecStart( nParts );
    Aig_ManForEachCo( p, pObj, i )
        Vec_IntPush( (Vec_Int_t *)Vec_PtrEntry(vParts, i / nPartSize), i );
    return vParts;
}